

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O3

void __thiscall
pbrt::RGBColorSpace::RGBColorSpace
          (RGBColorSpace *this,Point2f r,Point2f g,Point2f b,SpectrumHandle *illuminant,
          RGBToSpectrumTable *rgbToSpectrumTable,Allocator alloc)

{
  SquareMatrix<3> *m_00;
  Float *pFVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  undefined1 (*pauVar8) [64];
  aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> *paVar9;
  SquareMatrix<3> *pSVar10;
  int iVar11;
  uint *puVar12;
  long lVar13;
  uint *puVar14;
  int k;
  long lVar15;
  Float (*m_01) [3];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar26 [56];
  undefined1 auVar25 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar29 [16];
  float fVar30;
  XYZ XVar31;
  SquareMatrix<3> r_1;
  SquareMatrix<3> m;
  uint local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> local_d8;
  char cStack_b4;
  undefined8 uStack_b0;
  undefined4 uStack_a0;
  uint uStack_90;
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  
  auVar19._8_56_ = in_register_00001288;
  auVar19._0_8_ = b.super_Tuple2<pbrt::Point2,_float>;
  auVar18._8_56_ = in_register_00001248;
  auVar18._0_8_ = g.super_Tuple2<pbrt::Point2,_float>;
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = r.super_Tuple2<pbrt::Point2,_float>;
  local_f8 = auVar17._0_16_;
  local_e8 = auVar18._0_16_;
  auVar29 = vmovlhps_avx(local_f8,local_e8);
  auStack_78 = auVar19._0_16_;
  this->r = (Point2f)auVar29._0_8_;
  this->g = (Point2f)auVar29._8_8_;
  TVar2 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auStack_78);
  (this->b).super_Tuple2<pbrt::Point2,_float> = TVar2;
  (this->w).super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  local_d8._0_8_ =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->illuminant,(SpectrumHandle *)&local_d8.__align,0x168,0x33e,alloc);
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  m_00 = &this->XYZFromRGB;
  lVar7 = 0;
  pSVar10 = m_00;
  do {
    auVar19 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar4,(char)uVar3));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar20._0_12_ = auVar19._0_12_;
    auVar20._12_4_ = pSVar10->m[1][0];
    auVar20._16_4_ = pSVar10->m[1][1];
    auVar20._20_4_ = pSVar10->m[1][2];
    auVar20._24_4_ = pSVar10->m[2][0];
    auVar20._28_4_ = pSVar10->m[2][1];
    auVar20._32_4_ = pSVar10->m[2][2];
    auVar20._36_4_ = pSVar10[1].m[0][0];
    auVar20._40_4_ = pSVar10[1].m[0][1];
    auVar20._44_4_ = pSVar10[1].m[0][2];
    auVar20._48_4_ = pSVar10[1].m[1][0];
    auVar20._52_4_ = pSVar10[1].m[1][1];
    auVar20._56_4_ = pSVar10[1].m[1][2];
    auVar20._60_4_ = pSVar10[1].m[2][0];
    *(undefined1 (*) [64])pSVar10 = auVar20;
    pSVar10 = (SquareMatrix<3> *)(pSVar10->m + 1);
  } while (lVar7 != 3);
  lVar7 = 0;
  pSVar10 = &this->RGBFromXYZ;
  do {
    auVar19 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar4,(char)uVar3));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar21._0_12_ = auVar19._0_12_;
    auVar21._12_4_ = pSVar10->m[1][0];
    auVar21._16_4_ = pSVar10->m[1][1];
    auVar21._20_4_ = pSVar10->m[1][2];
    auVar21._24_4_ = pSVar10->m[2][0];
    auVar21._28_4_ = pSVar10->m[2][1];
    auVar21._32_4_ = pSVar10->m[2][2];
    auVar21._36_4_ = *(undefined4 *)(pSVar10 + 1);
    auVar21._40_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 4);
    auVar21._44_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 8);
    auVar21._48_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 0xc);
    auVar21._52_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 0x10);
    auVar21._56_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 0x14);
    auVar21._60_4_ = *(undefined4 *)((long)(pSVar10 + 1) + 0x18);
    *(undefined1 (*) [64])pSVar10 = auVar21;
    pSVar10 = (SquareMatrix<3> *)(pSVar10->m + 1);
  } while (lVar7 != 3);
  this->rgbToSpectrumTable = rgbToSpectrumTable;
  local_60.bits =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  auVar26 = ZEXT856(auVar19._8_8_);
  XVar31 = SpectrumToXYZ((SpectrumHandle *)&local_60);
  auVar25._0_8_ = XVar31._0_8_;
  auVar25._8_56_ = auVar26;
  auStack_88 = auVar25._0_16_;
  auVar24 = vmovshdup_avx(auStack_88);
  local_40 = 0.0;
  auVar29 = ZEXT816(0) << 0x40;
  fVar30 = XVar31.Z + XVar31.X + auVar24._0_4_;
  auVar27._4_4_ = fVar30;
  auVar27._0_4_ = fVar30;
  auVar27._8_4_ = fVar30;
  auVar27._12_4_ = fVar30;
  auVar16 = vmovshdup_avx(local_f8);
  auVar28 = vdivps_avx(auStack_88,auVar27);
  auVar27 = ZEXT416(0) << 0x20;
  TVar2 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar28);
  (this->w).super_Tuple2<pbrt::Point2,_float> = TVar2;
  local_3c = 0.0;
  fVar30 = auVar16._0_4_;
  if ((fVar30 != 0.0) || (NAN(fVar30))) {
    auVar29._0_4_ = local_f8._0_4_ / fVar30;
    auVar29._4_12_ = local_f8._4_12_;
    auVar29 = vblendps_avx(auVar29,_DAT_00606c80,0xe);
    local_40 = ((1.0 - local_f8._0_4_) - fVar30) / fVar30;
  }
  auVar28 = vmovshdup_avx(local_e8);
  fVar30 = auVar28._0_4_;
  if ((fVar30 != 0.0) || (NAN(fVar30))) {
    auVar28._0_4_ = local_e8._0_4_ / fVar30;
    auVar28._4_12_ = local_e8._4_12_;
    auVar27 = vblendps_avx(auVar28,_DAT_00606c80,0xe);
    local_3c = ((1.0 - local_e8._0_4_) - fVar30) / fVar30;
  }
  local_e8._0_4_ = XVar31.Z;
  local_38 = 0.0;
  auVar28 = ZEXT816(0) << 0x40;
  auVar16 = vmovshdup_avx(auStack_78);
  fVar30 = auVar16._0_4_;
  if ((fVar30 != 0.0) || (NAN(fVar30))) {
    auVar16._0_4_ = auStack_78._0_4_ / fVar30;
    auVar16._4_12_ = auStack_78._4_12_;
    auVar28 = vblendps_avx(auVar16,_DAT_00606c80,0xe);
    local_38 = ((1.0 - auStack_78._0_4_) - fVar30) / fVar30;
  }
  m_01 = (Float (*) [3])local_58;
  auVar16 = vpermt2ps_avx512vl(auVar29,_DAT_007a2f40,auVar27);
  auVar29 = vinsertps_avx(auVar28,auVar27,0x4c);
  local_58 = vinsertps_avx(auVar16,auVar28,0x20);
  local_48 = vmovlps_avx(auVar29);
  paVar9 = &local_d8;
  local_f8 = auVar24;
  Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&paVar9->__align,(SquareMatrix<3> *)m_01);
  auVar29 = local_f8;
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  if (cStack_b4 == '\0') {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
  uVar5 = local_e8._0_4_;
  lVar7 = 0;
  uStack_b0 = 0;
  local_fc = 0;
  do {
    iVar11 = (int)lVar7;
    puVar12 = (uint *)&uStack_b0;
    if ((iVar11 != 0) && (puVar12 = (uint *)((long)&uStack_b0 + 4), iVar11 != 1)) {
      puVar12 = &local_fc;
    }
    *puVar12 = 0;
    lVar13 = 0;
    do {
      auVar27 = auStack_88;
      if (((int)lVar13 != 0) && (auVar27 = auVar29, (int)lVar13 != 1)) {
        auVar27 = ZEXT416((uint)uVar5);
      }
      puVar12 = (uint *)&uStack_b0;
      if ((iVar11 != 0) && (puVar12 = (uint *)((long)&uStack_b0 + 4), iVar11 != 1)) {
        puVar12 = &local_fc;
      }
      lVar15 = lVar13 * 4;
      lVar13 = lVar13 + 1;
      auVar27 = vfmadd213ss_fma(auVar27,ZEXT416(*(uint *)((long)paVar9 + lVar15)),ZEXT416(*puVar12))
      ;
      *puVar12 = auVar27._0_4_;
      uVar6 = uStack_b0;
    } while (lVar13 != 3);
    lVar7 = lVar7 + 1;
    paVar9 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> *)
             ((long)paVar9 + 0xc);
  } while (lVar7 != 3);
  pauVar8 = (undefined1 (*) [64])&uStack_b0;
  lVar7 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar4,(char)uVar3));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar22._0_12_ = auVar19._0_12_;
    auVar22._12_4_ = *(undefined4 *)((long)*pauVar8 + 0xc);
    auVar22._16_4_ = *(undefined4 *)((long)*pauVar8 + 0x10);
    auVar22._20_4_ = *(undefined4 *)((long)*pauVar8 + 0x14);
    auVar22._24_4_ = *(undefined4 *)((long)*pauVar8 + 0x18);
    auVar22._28_4_ = *(undefined4 *)((long)*pauVar8 + 0x1c);
    auVar22._32_4_ = *(undefined4 *)((long)*pauVar8 + 0x20);
    auVar22._36_4_ = *(undefined4 *)((long)*pauVar8 + 0x24);
    auVar22._40_4_ = *(undefined4 *)((long)*pauVar8 + 0x28);
    auVar22._44_4_ = *(undefined4 *)((long)*pauVar8 + 0x2c);
    auVar22._48_4_ = *(undefined4 *)((long)*pauVar8 + 0x30);
    auVar22._52_4_ = *(undefined4 *)((long)*pauVar8 + 0x34);
    auVar22._56_4_ = *(undefined4 *)((long)*pauVar8 + 0x38);
    auVar22._60_4_ = *(undefined4 *)((long)*pauVar8 + 0x3c);
    *pauVar8 = auVar22;
    pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0xc);
  } while (lVar7 != 3);
  paVar9 = &local_d8;
  uStack_b0._0_4_ = (int)uVar6;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar6;
  uStack_a0 = vextractps_avx(auVar24,1);
  uStack_90 = local_fc;
  lVar7 = 0;
  do {
    auVar19 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar3 = vpcmpeqq_avx512f(auVar19,auVar17);
    uVar4 = vpcmpeqq_avx512f(auVar19,auVar18);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar4,(char)uVar3));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar23._0_12_ = auVar19._0_12_;
    auVar23._12_4_ = *(undefined4 *)((long)paVar9 + 0xc);
    auVar23._16_4_ = *(undefined4 *)((long)paVar9 + 0x10);
    auVar23._20_4_ = *(undefined4 *)((long)paVar9 + 0x14);
    auVar23._24_4_ = *(undefined4 *)((long)paVar9 + 0x18);
    auVar23._28_4_ = *(undefined4 *)((long)paVar9 + 0x1c);
    auVar23._32_4_ = *(undefined4 *)((long)paVar9 + 0x20);
    auVar23._36_4_ = paVar9[1].__align;
    auVar23._40_4_ = *(undefined4 *)((long)paVar9 + 0x28);
    auVar23._44_4_ = *(undefined4 *)((long)paVar9 + 0x2c);
    auVar23._48_4_ = *(undefined4 *)((long)paVar9 + 0x30);
    auVar23._52_4_ = *(undefined4 *)((long)paVar9 + 0x34);
    auVar23._56_4_ = *(undefined4 *)((long)paVar9 + 0x38);
    auVar23._60_4_ = *(undefined4 *)((long)paVar9 + 0x3c);
    *(undefined1 (*) [64])paVar9 = auVar23;
    paVar9 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> *)
             ((long)paVar9 + 0xc);
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    lVar13 = 0;
    puVar12 = (uint *)&uStack_b0;
    do {
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      lVar15 = 0;
      puVar14 = puVar12;
      do {
        pFVar1 = *(Float (*) [3])*m_01 + lVar15;
        lVar15 = lVar15 + 1;
        auVar29 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416((uint)*pFVar1),ZEXT416(*puVar14));
        auVar17 = ZEXT1664(auVar29);
        puVar14 = puVar14 + 3;
      } while (lVar15 != 3);
      *(int *)((long)&local_d8 + lVar13 * 4 + lVar7 * 0xc) = auVar29._0_4_;
      lVar13 = lVar13 + 1;
      puVar12 = puVar12 + 1;
    } while (lVar13 != 3);
    lVar7 = lVar7 + 1;
    m_01 = m_01 + 1;
  } while (lVar7 != 3);
  (this->XYZFromRGB).m[2][2] = (Float)local_d8._32_4_;
  *(undefined8 *)m_00->m[0] = local_d8._0_8_;
  *(undefined8 *)((this->XYZFromRGB).m[0] + 2) = local_d8._8_8_;
  *(undefined8 *)((this->XYZFromRGB).m[1] + 1) = local_d8._16_8_;
  *(undefined8 *)(this->XYZFromRGB).m[2] = local_d8._24_8_;
  Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&local_d8.__align,m_00);
  if (cStack_b4 != '\0') {
    (this->RGBFromXYZ).m[2][2] = (Float)local_d8._32_4_;
    *(undefined8 *)(this->RGBFromXYZ).m[0] = local_d8._0_8_;
    *(undefined8 *)((this->RGBFromXYZ).m[0] + 2) = local_d8._8_8_;
    *(undefined8 *)((this->RGBFromXYZ).m[1] + 1) = local_d8._16_8_;
    *(undefined8 *)(this->RGBFromXYZ).m[2] = local_d8._24_8_;
    return;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
}

Assistant:

RGBColorSpace::RGBColorSpace(Point2f r, Point2f g, Point2f b, SpectrumHandle illuminant,
                             const RGBToSpectrumTable *rgbToSpectrumTable,
                             Allocator alloc)
    : r(r),
      g(g),
      b(b),
      illuminant(illuminant, alloc),
      rgbToSpectrumTable(rgbToSpectrumTable) {
    // Compute whitepoint primaries
    XYZ W = SpectrumToXYZ(illuminant);
    w = W.xy();

    // Compute XYZ coordinates of primaries
    XYZ R = XYZ::FromxyY(r), G = XYZ::FromxyY(g), B = XYZ::FromxyY(b);

    // Compute _XYZFromRGB_ matrix for color space
    SquareMatrix<3> rgb(R.X, G.X, B.X, R.Y, G.Y, B.Y, R.Z, G.Z, B.Z);
    XYZ C = *Inverse(rgb) * W;
    XYZFromRGB = rgb * SquareMatrix<3>::Diag(C[0], C[1], C[2]);

    // Compute _RGBFromXYZ_ matrix for color space
    RGBFromXYZ = *Inverse(XYZFromRGB);
}